

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  _func_int *p_Var4;
  undefined8 uVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined1 auVar8 [8];
  byte bVar9;
  int k_3;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Layer *pLVar14;
  byte bVar15;
  int k_2;
  int iVar16;
  int iVar17;
  long lVar18;
  _func_int **pp_Var19;
  void *pvVar20;
  undefined4 *puVar21;
  uint uVar22;
  _func_int **pp_Var23;
  _func_int **pp_Var24;
  _func_int *p_Var25;
  ulong uVar26;
  undefined4 *puVar27;
  undefined1 auVar28 [8];
  char cVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  Mat *pMVar34;
  long lVar35;
  bool bVar36;
  byte bVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  uint _c;
  long lVar41;
  int iVar42;
  _func_int **pp_Var43;
  long lVar44;
  long lVar45;
  _func_int **pp_Var46;
  int k_1;
  long lVar47;
  int k;
  int iVar48;
  ulong uVar49;
  undefined4 *puVar50;
  long lVar51;
  long lVar52;
  Convolution_x86 *pCVar53;
  _func_int *p_Var54;
  long lVar55;
  long lVar56;
  void *pvVar57;
  void *pvVar58;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [8];
  ulong local_1e0;
  ulong local_1d8;
  undefined1 local_1d0 [8];
  ParamDict pd_6;
  ParamDict pd;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  int local_1a0;
  Allocator *local_198;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  int iStack_184;
  int aiStack_180 [2];
  size_t local_178;
  void *local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  long *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined8 local_130;
  Convolution_x86 *local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  ulong local_100;
  long local_f8;
  void *local_f0;
  ParamDict pd_5;
  ModelBinFromMatArray local_40;
  
  p_Var25 = this->_vptr_Convolution_x86[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var25) != 0) {
    return 0;
  }
  local_1e8 = (undefined1  [8])opt;
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var25)) {
  case 1:
    pLVar14 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  case 2:
    pLVar14 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var25));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  case 3:
    pLVar14 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var25));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var25) + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  case 4:
    pLVar14 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  case 5:
    pLVar14 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  case 6:
    pLVar14 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var25));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var25) + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&pd);
    break;
  default:
    pLVar14 = (Layer *)0x0;
    goto LAB_001af1de;
  }
  ParamDict::~ParamDict(&pd);
LAB_001af1de:
  auVar8 = local_1e8;
  if (pLVar14 != (Layer *)0x0) {
    (*pLVar14->_vptr_Layer[4])(pLVar14,local_1e8);
  }
  auVar28 = local_1e8;
  this->activation = pLVar14;
  this->nT = *(int *)((long)auVar8 + 4);
  if ((*(bool *)((long)auVar8 + 0x1e) == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)this->_vptr_Convolution_x86[-3]) ==
      1)) {
    create_pipeline_int8_x86(this,(Option *)local_1e8);
    return 0;
  }
  p_Var25 = this->_vptr_Convolution_x86[-3];
  uVar11 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var25);
  iVar48 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var25);
  iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var25);
  uVar26 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var25 + 4)) /
           (long)(iVar16 * iVar48);
  uVar26 = (long)((ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff) /
           (long)(int)uVar11;
  uVar22 = (uint)uVar26;
  if ((((iVar48 == iVar16 && *(bool *)((long)local_1e8 + 0x27) == false) &&
       (iVar13 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var25), iVar13 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var25) == iVar13)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var25) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var25) == 1)))) {
    pLVar14 = create_layer(6);
    this->convolution_dilation1 = pLVar14;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var46 = this->_vptr_Convolution_x86;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var46[-3]) == 0) {
      local_178 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_1a4 = 0;
      local_1a0 = 0;
      local_198 = (Allocator *)0x0;
      iStack_190 = 0;
      iStack_18c = 0;
      iStack_188 = 0;
      iStack_184 = 0;
      aiStack_180[0] = 0;
      p_Var25 = pp_Var46[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var25);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var25);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_1a4 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var25) >> 0x20);
        local_1a0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var25);
        local_198 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var25);
        uVar5 = *(undefined8 *)((long)&this->gemm + (long)p_Var25);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var25);
        iStack_190 = (int)uVar5;
        iStack_18c = (int)((ulong)uVar5 >> 0x20);
        iStack_188 = (int)uVar7;
        iStack_184 = (int)((ulong)uVar7 >> 0x20);
        aiStack_180[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var25);
        local_178 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var25);
      }
      pLVar14 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar14->_vptr_Layer[3])(pLVar14,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_198 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_198->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar18 = 0x40;
      do {
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
        *(undefined8 *)((long)&uStack_1f8 + lVar18) = 0;
        *(undefined8 *)(local_1f0 + lVar18) = 0;
        *(undefined8 *)(local_1f0 + lVar18 + 4) = 0;
        *(undefined8 *)(local_1e8 + lVar18 + 4) = 0;
        *(undefined8 *)((long)&local_1d8 + lVar18) = 0;
        *(undefined8 *)(local_1d0 + lVar18) = 0;
        *(undefined8 *)(local_1d0 + lVar18 + 4) = 0;
        *(undefined8 *)((long)&pd_6._vptr_ParamDict + lVar18 + 4) = 0;
        lVar18 = lVar18 + 0x48;
      } while (lVar18 != 0xd0);
      p_Var25 = pp_Var46[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var25);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_198 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_198->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var25);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_1a4 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var25) >> 0x20);
        local_1a0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var25);
        local_198 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var25);
        iStack_190 = *(int *)((long)&this->gemm + (long)p_Var25);
        iStack_18c = *(int *)((long)&this->gemm + (long)(p_Var25 + 4));
        iStack_188 = *(int *)((long)&(this->scale_in_data).data + (long)p_Var25);
        iStack_184 = *(int *)((long)&(this->scale_in_data).data + (long)(p_Var25 + 4));
        aiStack_180[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var25);
        local_178 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var25);
      }
      p_Var25 = this->_vptr_Convolution_x86[-3];
      if (&local_170 != (void **)((long)&(this->scale_in_data).elempack + (long)p_Var25)) {
        piVar1 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var25);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(uStack_164,uStack_168);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_150 == (long *)0x0) {
              if (local_170 != (void *)0x0) {
                free(local_170);
              }
            }
            else {
              (**(code **)(*local_150 + 0x18))();
            }
          }
        }
        local_170 = *(void **)((long)&(this->scale_in_data).elempack + (long)p_Var25);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var25);
        uStack_168 = (undefined4)uVar5;
        uStack_164 = (undefined4)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var25);
        uStack_160 = (undefined4)uVar5;
        uStack_15c = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_158 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var25);
        local_150 = *(long **)((long)&(this->scale_in_data).c + (long)p_Var25);
        local_148 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var25);
        uStack_140 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var25);
        local_138 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var25);
        local_130 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var25);
      }
      pLVar14 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar14->_vptr_Layer[3])(pLVar14,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar18 = 0x48;
      do {
        piVar1 = *(int **)((long)&pd.d + lVar18);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar20 = *(void **)((long)&pd._vptr_ParamDict + lVar18);
            if (*(long **)((long)&local_198 + lVar18) == (long *)0x0) {
              if (pvVar20 != (void *)0x0) {
                free(pvVar20);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_198 + lVar18) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_178 + lVar18) = 0;
        *(undefined8 *)((long)&pd.d + lVar18 + 4) = 0;
        *(undefined8 *)((long)&uStack_1a4 + lVar18) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
        *(undefined8 *)((long)&pd.d + lVar18) = 0;
        *(undefined8 *)((long)&iStack_190 + lVar18) = 0;
        *(undefined8 *)((long)&iStack_188 + lVar18) = 0;
        *(undefined4 *)((long)aiStack_180 + lVar18) = 0;
        lVar18 = lVar18 + -0x48;
      } while (lVar18 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,local_1e8);
    if (*(bool *)local_1e8 == true) {
      p_Var25 = this->_vptr_Convolution_x86[-3];
      piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var25);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar20 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
          plVar6 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var25);
          if (plVar6 == (long *)0x0) {
            if (pvVar20 != (void *)0x0) {
              free(pvVar20);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var25) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var25) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var25) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var25) = 0;
      *(undefined8 *)((long)&this->gemm + (long)p_Var25) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var25) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var25) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  cVar29 = '\x01';
  local_1d8 = 1;
  if (*(bool *)((long)local_1e8 + 0x27) != false) {
    local_1d8 = (ulong)((uint)((uVar26 & 3) == 0) * 3 + 1);
    cVar29 = ((uVar11 & 3) == 0) * '\x03' + '\x01';
  }
  bVar37 = *(bool *)((long)local_1e8 + 0x37);
  if ((((bool)bVar37 == false) && (*(bool *)((long)local_1e8 + 0x38) == false)) &&
     (*(bool *)((long)local_1e8 + 0x39) != true)) {
    bVar36 = false;
  }
  else {
    bVar36 = 8 < (int)uVar11 || 8 < (int)uVar22;
  }
  uStack_1f8._4_4_ = uVar22;
  local_128 = this;
  if ((((iVar16 == 3) && (iVar48 == 3)) && (*(bool *)((long)local_1e8 + 0x1c) != false)) &&
     (((bVar36 && (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var25) == 1)) &&
      ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var25) == 1 &&
       ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var25) == 1 &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var25) == 1)))))))) {
    lVar18 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var25);
    if ((((lVar18 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var25)) ||
         (*(int *)(lVar18 + 0x2c) == 0)) || (*(int *)(lVar18 + 0x30) == 0)) &&
       (((lVar47 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var25),
         lVar47 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var25) ||
         (*(int *)(lVar47 + 0x2c) == 0)) || (*(int *)(lVar47 + 0x30) == 0)))) {
      if ((((int)uVar11 < 0x21) && (*(bool *)((long)local_1e8 + 0x39) != false)) &&
         ((int)uVar22 < 0x21)) {
        pMVar34 = &this->weight_winograd63_data;
LAB_001b0ad7:
        pCVar53 = local_128;
        conv3x3s1_winograd63_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25),pMVar34,
                   uStack_1f8._4_4_,uVar11,(Option *)local_1e8);
        auVar28 = local_1e8;
      }
      else {
        pMVar34 = (Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        pCVar53 = this;
        if (*(bool *)((long)local_1e8 + 0x38) == true) {
          conv3x3s1_winograd43_transform_kernel
                    (pMVar34,&this->weight_winograd43_data,uVar22,uVar11,(Option *)local_1e8);
        }
        else {
          conv3x3s1_winograd23_transform_kernel
                    (pMVar34,&this->weight_winograd23_data,uVar22,uVar11,(Option *)local_1e8);
        }
      }
    }
    else {
      lVar47 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var25);
      if (((lVar47 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var25)) ||
          (*(int *)(lVar47 + 0x2c) == 0)) || (*(int *)(lVar47 + 0x30) == 0)) {
        iVar48 = *(int *)(lVar18 + 0x2c);
        iVar16 = *(int *)(lVar18 + 0x30);
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var25 + 4));
        if ((((iVar13 < 1) &&
             (iVar17 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var25),
             iVar17 < 1)) &&
            (iVar42 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var25 + 4)),
            iVar42 < 1)) &&
           (iVar10 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var25),
           iVar10 < 1)) {
          if ((iVar10 == -0xe9 && (iVar42 == -0xe9 && (iVar17 == -0xe9 && iVar13 == -0xe9))) ||
             (iVar10 == -0xea && (iVar42 == -0xea && (iVar17 == -0xea && iVar13 == -0xea)))) {
            iVar48 = iVar48 + 2;
            iVar16 = iVar16 + 2;
          }
        }
        else {
          iVar48 = iVar13 + iVar48 +
                   *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var25);
          iVar16 = iVar16 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var25 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var25);
        }
      }
      else {
        iVar48 = *(int *)(lVar47 + 0x2c) + 2;
        iVar16 = *(int *)(lVar47 + 0x30) + 2;
      }
      bVar36 = test_prefer_winograd63(uVar22,uVar11,iVar48,iVar16);
      local_1f0[0] = bVar36;
      bVar36 = test_prefer_winograd23(uVar22,uVar11,iVar48,iVar16);
      pCVar53 = local_128;
      bVar15 = bVar36 & bVar37;
      if (!bVar36) {
        bVar37 = local_1f0[0];
      }
      bVar9 = local_1f0[0] & *(bool *)((long)local_1e8 + 0x39);
      bVar37 = (*(bool *)((long)local_1e8 + 0x39) ^ 1U) & local_1f0[0] | bVar37 ^ 1;
      if ((bVar37 == 1) && (*(bool *)((long)local_1e8 + 0x38) == false)) {
        bVar9 = bVar9 | *(bool *)((long)local_1e8 + 0x39);
        bVar15 = bVar15 | *(bool *)((long)local_1e8 + 0x39) ^ 1U;
        bVar37 = 0;
      }
      if (bVar15 == 0) {
        if (bVar37 == 0) {
          auVar28 = local_1e8;
          if ((bVar9 & 1) != 0) {
            pMVar34 = &local_128->weight_winograd63_data;
            goto LAB_001b0ad7;
          }
        }
        else {
          conv3x3s1_winograd43_transform_kernel
                    ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25),
                     &local_128->weight_winograd43_data,uStack_1f8._4_4_,uVar11,(Option *)local_1e8)
          ;
          auVar28 = local_1e8;
        }
      }
      else {
        conv3x3s1_winograd23_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25),
                   &local_128->weight_winograd23_data,uStack_1f8._4_4_,uVar11,(Option *)local_1e8);
        auVar28 = local_1e8;
      }
    }
    if (((Option *)auVar28)->lightmode != true) {
      return 0;
    }
    p_Var4 = pCVar53->_vptr_Convolution_x86[-3];
    p_Var25 = (_func_int *)((long)&pCVar53->_vptr_Convolution_x86 + (long)p_Var4);
    p_Var54 = (_func_int *)((long)&(pCVar53->weight_winograd63_data).dims + (long)p_Var4);
    piVar1 = *(int **)((long)&(pCVar53->weight_winograd63_data).h + (long)p_Var4);
    if (piVar1 == (int *)0x0) goto LAB_001aff2d;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_001aff2d;
    pvVar20 = *(void **)(p_Var25 + 0x160);
    plVar6 = *(long **)(p_Var25 + 0x180);
  }
  else {
    iVar10 = get_cpu_level2_cache_size();
    p_Var25 = this->_vptr_Convolution_x86[-3];
    uVar11 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var25);
    iVar48 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var25);
    uVar12 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var25);
    local_1f0 = (undefined1  [8])(ulong)uVar12;
    iVar16 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var25);
    iVar13 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var25);
    iVar17 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var25);
    iVar42 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var25);
    if (((*(bool *)((long)auVar28 + 0x1d) == true) &&
        (iVar10 < (int)(uVar11 * iVar48 * uVar12 * iVar16 * iVar13 * iVar17 * iVar42 * uVar22 * 8)
         || (0x10 < (int)uVar22 || 0x10 < (int)uVar11))) || (uVar12 == 1 && iVar48 == 1)) {
      pLVar14 = create_layer(0x4a);
      this->gemm = pLVar14;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar11 = local_1f0._0_4_ * iVar48;
      local_1f0 = (undefined1  [8])(ulong)uVar11;
      iVar48 = uVar11 * uStack_1f8._4_4_;
      ParamDict::set(&pd_6,9,iVar48);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      pMVar34 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86[-3]);
      Mat::reshape((Mat *)&pd,pMVar34,local_1f0._0_4_,uStack_1f8._4_4_,*(int *)&pMVar34[-2].data,
                   (Allocator *)0x0);
      Mat::create((Mat *)&pd_5,iVar48,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86[-3]),4,(Allocator *)0x0);
      pCVar53 = local_128;
      pp_Var46 = this->_vptr_Convolution_x86;
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var46[-3])) {
        local_1d0 = (undefined1  [8])pd_5._vptr_ParamDict;
        uVar26 = local_1d8 & 0xffffffff;
        lVar18 = 0;
        do {
          if ((int)local_1d8 <= (int)uStack_1f8._4_4_) {
            lVar47 = (long)iStack_18c * CONCAT44(uStack_1a4,local_1a8);
            pp_Var19 = (_func_int **)
                       (CONCAT44(uStack_1a4,local_1a8) * local_178 * lVar18 +
                       (long)pd._vptr_ParamDict);
            lVar56 = 0;
            pp_Var43 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar49 = 0;
                pp_Var24 = pp_Var19;
                uVar32 = uVar26;
                pp_Var23 = pp_Var19;
                do {
                  do {
                    *(undefined4 *)pp_Var43 = *(undefined4 *)pp_Var24;
                    pp_Var43 = (_func_int **)((long)pp_Var43 + 4);
                    uVar32 = uVar32 - 1;
                    pp_Var24 = (_func_int **)((long)pp_Var24 + lVar47);
                  } while (uVar32 != 0);
                  uVar49 = uVar49 + 1;
                  pp_Var24 = (_func_int **)((long)pp_Var23 + 4);
                  uVar32 = uVar26;
                  pp_Var23 = pp_Var24;
                } while (uVar49 != ((ulong)local_1f0 & 0xffffffff));
              }
              lVar56 = lVar56 + uVar26;
              pp_Var19 = (_func_int **)((long)pp_Var19 + lVar47 * uVar26);
            } while (lVar56 < (long)((long)(int)uStack_1f8._4_4_ - (ulong)((int)local_1d8 - 1)));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)((long)&(local_128->weight_winograd23_data).dims +
                                  (long)pp_Var46[-3]));
      }
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_198 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_198->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(pCVar53->weight_winograd43_data).elemsize +
                  (long)pCVar53->_vptr_Convolution_x86[-3]) == 0) {
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        uStack_1a4 = 0;
        local_1a0 = 0;
        local_198 = (Allocator *)0x0;
        iStack_190 = 0;
        iStack_18c = 0;
        iStack_188 = 0;
        iStack_184 = 0;
        aiStack_180[0] = 0;
        local_178 = 0;
        pLVar14 = pCVar53->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_40);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
        piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_198 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_198->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar18 = 0x40;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
          *(undefined8 *)((long)&uStack_1f8 + lVar18) = 0;
          *(undefined8 *)(local_1f0 + lVar18) = 0;
          *(undefined8 *)(local_1f0 + lVar18 + 4) = 0;
          *(undefined8 *)(local_1e8 + lVar18 + 4) = 0;
          *(undefined8 *)((long)&local_1d8 + lVar18) = 0;
          *(undefined8 *)(local_1d0 + lVar18) = 0;
          *(undefined8 *)(local_1d0 + lVar18 + 4) = 0;
          *(undefined8 *)((long)&pd_6._vptr_ParamDict + lVar18 + 4) = 0;
          lVar18 = lVar18 + 0x48;
        } while (lVar18 != 0xd0);
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_198 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_198->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        uStack_1a4 = 0;
        local_1a0 = 0;
        local_198 = (Allocator *)0x0;
        iStack_190 = 0;
        iStack_18c = 0;
        iStack_188 = 0;
        iStack_184 = 0;
        aiStack_180[0] = 0;
        local_178 = 0;
        p_Var25 = pCVar53->_vptr_Convolution_x86[-3];
        if (&local_170 != (void **)((long)&(pCVar53->scale_in_data).elempack + (long)p_Var25)) {
          piVar1 = *(int **)((long)&(pCVar53->scale_in_data).allocator + (long)p_Var25);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = (int *)CONCAT44(uStack_164,uStack_168);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_150 == (long *)0x0) {
                if (local_170 != (void *)0x0) {
                  free(local_170);
                }
              }
              else {
                (**(code **)(*local_150 + 0x18))();
              }
            }
          }
          local_170 = *(void **)((long)&(pCVar53->scale_in_data).elempack + (long)p_Var25);
          uVar5 = *(undefined8 *)((long)&(pCVar53->scale_in_data).allocator + (long)p_Var25);
          uStack_168 = (undefined4)uVar5;
          uStack_164 = (undefined4)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)((long)&(pCVar53->scale_in_data).dims + (long)p_Var25);
          uStack_160 = (undefined4)uVar5;
          uStack_15c = (undefined4)((ulong)uVar5 >> 0x20);
          uStack_158 = *(undefined4 *)((long)&(pCVar53->scale_in_data).h + (long)p_Var25);
          local_150 = *(long **)((long)&(pCVar53->scale_in_data).c + (long)p_Var25);
          local_148 = *(undefined8 *)((long)&(pCVar53->scale_in_data).cstep + (long)p_Var25);
          uStack_140 = *(undefined8 *)(&pCVar53->field_0x1d8 + (long)p_Var25);
          local_138 = *(undefined4 *)(&pCVar53->field_0x1e0 + (long)p_Var25);
          local_130 = *(undefined8 *)(&pCVar53->field_0x1e8 + (long)p_Var25);
        }
        pLVar14 = pCVar53->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_40);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
        lVar18 = 0x48;
        do {
          piVar1 = *(int **)((long)&pd.d + lVar18);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar20 = *(void **)((long)&pd._vptr_ParamDict + lVar18);
              if (*(long **)((long)&local_198 + lVar18) == (long *)0x0) {
                if (pvVar20 != (void *)0x0) {
                  free(pvVar20);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_198 + lVar18) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_178 + lVar18) = 0;
          *(undefined8 *)((long)&pd.d + lVar18 + 4) = 0;
          *(undefined8 *)((long)&uStack_1a4 + lVar18) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar18) = 0;
          *(undefined8 *)((long)&pd.d + lVar18) = 0;
          *(undefined8 *)((long)&iStack_190 + lVar18) = 0;
          *(undefined8 *)((long)&iStack_188 + lVar18) = 0;
          *(undefined4 *)((long)aiStack_180 + lVar18) = 0;
          lVar18 = lVar18 + -0x48;
        } while (lVar18 != -0x48);
      }
      (*pCVar53->gemm->_vptr_Layer[4])(pCVar53->gemm,local_1e8);
      piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      ParamDict::~ParamDict(&pd_6);
    }
    else if (((cVar29 == '\x04') && ((int)local_1d8 == 1)) &&
            (((iVar48 == 3 &&
              ((((uVar12 == 3 && (iVar16 == 1)) && (iVar13 == 1)) &&
               ((iVar17 == 1 && (iVar42 == 1)))))) ||
             ((iVar48 == 3 &&
              (((uVar12 == 3 && (iVar16 == 1)) &&
               ((iVar13 == 1 && ((iVar17 == 2 && (iVar42 == 2)))))))))))) {
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25),
                 &this->weight_data_tm,uStack_1f8._4_4_,uVar11,iVar48,uVar12,1,4);
    }
    else {
      uVar12 = uVar12 * iVar48;
      local_1f0 = (undefined1  [8])(ulong)uVar12;
      uVar22 = uStack_1f8._4_4_;
      local_1e0 = (ulong)uVar11;
      if ((int)uVar11 < 4) {
        if ((int)uVar11 < 2) {
          if (3 < (int)uStack_1f8._4_4_) {
            iVar16 = uVar12 * 4;
            iVar48 = (uStack_1f8._4_4_ & 1) + (uStack_1f8._4_4_ >> 2) +
                     (uint)((uStack_1f8._4_4_ >> 1 & 1) != 0);
            uVar22 = uVar11;
            goto LAB_001afce4;
          }
          _c = uVar11;
          if (1 < (int)uStack_1f8._4_4_) {
            uVar12 = uVar12 * 2;
            uVar22 = (uStack_1f8._4_4_ & 1) + 1;
          }
          goto LAB_001b009a;
        }
        if ((int)uStack_1f8._4_4_ < 4) {
          if ((int)uStack_1f8._4_4_ < 2) {
            uVar12 = uVar12 * 2;
          }
          else {
            uVar12 = uVar12 * 4;
            uVar22 = (uStack_1f8._4_4_ & 1) + 1;
          }
          _c = (uVar11 & 1) + 1;
          goto LAB_001b009a;
        }
        iVar48 = (uStack_1f8._4_4_ & 1) + (uStack_1f8._4_4_ >> 2) +
                 (uint)((uStack_1f8._4_4_ >> 1 & 1) != 0);
        iVar16 = uVar12 * 8;
        uVar22 = (uVar11 & 1) + 1;
LAB_001afce4:
        Mat::create(&this->weight_data_tm,iVar16,iVar48,uVar22,4,(Allocator *)0x0);
        uVar22 = (uint)local_1e0;
      }
      else {
        if ((int)uStack_1f8._4_4_ < 4) {
          if ((int)uStack_1f8._4_4_ < 2) {
            uVar12 = uVar12 * 4;
            _c = (uVar11 & 1) + (uVar11 >> 2) + (uint)((uVar11 >> 1 & 1) != 0);
            goto LAB_001b009a;
          }
          uVar12 = uVar12 * 8;
          uVar22 = (uStack_1f8._4_4_ & 1) + 1;
        }
        else {
          uVar12 = uVar12 * 0x10;
          uVar22 = (uStack_1f8._4_4_ & 1) + (uStack_1f8._4_4_ >> 2) +
                   (uint)((uStack_1f8._4_4_ >> 1 & 1) != 0);
        }
        _c = (uVar11 & 1) + (uVar11 >> 2) + (uint)((uVar11 >> 1 & 1) != 0);
LAB_001b009a:
        Mat::create(&this->weight_data_tm,uVar12,uVar22,_c,4,(Allocator *)0x0);
        uVar22 = uVar11;
      }
      uVar26 = 0;
      pCVar53 = this;
      if (3 < (int)uVar22) {
        local_118 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        iVar17 = local_1f0._0_4_ * uStack_1f8._4_4_;
        pvVar20 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        sVar3 = (this->weight_data_tm).cstep;
        lVar47 = (long)(int)local_1f0._0_4_;
        local_1d8 = (ulong)(int)uStack_1f8._4_4_;
        uVar49 = (ulong)local_1f0 & 0xffffffff;
        local_100 = (ulong)uStack_1f8._4_4_;
        iVar13 = local_1f0._0_4_ * uStack_1f8._4_4_;
        iVar48 = iVar13 * 4;
        lVar56 = uVar49 * 0x10;
        lVar18 = lVar47 * 4;
        iVar16 = iVar13 * 3;
        iVar13 = iVar13 * 2;
        local_f8 = lVar47 * 8;
        iVar42 = 0;
        uVar32 = 0;
        do {
          local_108 = CONCAT44(local_108._4_4_,iVar17);
          lVar44 = (long)iVar42;
          puVar50 = (undefined4 *)((uVar32 >> 2) * sVar2 * sVar3 + (long)pvVar20);
          if ((int)uStack_1f8._4_4_ < 4) {
            uVar26 = 0;
          }
          else {
            pp_Var46 = (_func_int **)(local_118 + lVar44 * 4);
            lVar31 = local_118 + (long)iVar17 * 4;
            pvVar58 = (void *)(local_118 + (long)iVar13 * 4);
            lVar35 = local_118 + (long)iVar16 * 4;
            uVar39 = 0;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                lVar30 = lVar31;
                lVar38 = lVar35;
                pp_Var43 = pp_Var46;
                pvVar57 = pvVar58;
                do {
                  puVar27 = puVar50;
                  lVar51 = 0;
                  lVar33 = 0;
                  do {
                    *(undefined4 *)((long)puVar27 + lVar33) =
                         *(undefined4 *)((long)pp_Var43 + lVar51);
                    *(undefined4 *)((long)puVar27 + lVar33 + 4) = *(undefined4 *)(lVar30 + lVar51);
                    *(undefined4 *)((long)puVar27 + lVar33 + 8) =
                         *(undefined4 *)((long)pvVar57 + lVar51);
                    *(undefined4 *)((long)puVar27 + lVar33 + 0xc) = *(undefined4 *)(lVar38 + lVar51)
                    ;
                    lVar33 = lVar33 + 0x10;
                    lVar51 = lVar51 + lVar18;
                  } while ((int)lVar33 != 0x40);
                  uVar26 = uVar26 + 1;
                  pp_Var43 = (_func_int **)((long)pp_Var43 + 4);
                  lVar30 = lVar30 + 4;
                  pvVar57 = (void *)((long)pvVar57 + 4);
                  lVar38 = lVar38 + 4;
                  puVar50 = (undefined4 *)((long)puVar27 + lVar33);
                } while (uVar26 != uVar49);
                puVar50 = (undefined4 *)((long)puVar27 + lVar33);
                local_1d0 = (undefined1  [8])pp_Var46;
                local_120 = lVar31;
                local_f0 = pvVar58;
              }
              uVar26 = uVar39 + 4;
              lVar30 = uVar39 + 7;
              pp_Var46 = pp_Var46 + uVar49 * 2;
              lVar31 = lVar31 + lVar56;
              pvVar58 = (void *)((long)pvVar58 + lVar56);
              lVar35 = lVar35 + lVar56;
              uVar39 = uVar26;
              local_110 = lVar44;
            } while (lVar30 < (long)local_1d8);
          }
          lVar30 = (long)iVar16 * 4;
          lVar31 = (long)iVar13 * 4;
          lVar35 = (long)iVar17 * 4;
          lVar44 = lVar44 * 4;
          if ((int)((uint)uVar26 | 1) < (int)uStack_1f8._4_4_) {
            lVar38 = lVar18 * (uVar26 & 0xffffffff);
            pp_Var46 = (_func_int **)0x0;
            uVar39 = uVar26 & 0xffffffff;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                pp_Var43 = pp_Var46;
                do {
                  puVar27 = puVar50;
                  lVar33 = 0;
                  pp_Var19 = pp_Var43;
                  do {
                    *(undefined4 *)((long)puVar27 + lVar33) =
                         *(undefined4 *)(lVar44 + lVar38 + local_118 + (long)pp_Var19);
                    *(undefined4 *)((long)puVar27 + lVar33 + 4) =
                         *(undefined4 *)(lVar38 + lVar35 + local_118 + (long)pp_Var19);
                    *(undefined4 *)((long)puVar27 + lVar33 + 8) =
                         *(undefined4 *)(lVar38 + lVar31 + local_118 + (long)pp_Var19);
                    *(undefined4 *)((long)puVar27 + lVar33 + 0xc) =
                         *(undefined4 *)(lVar38 + lVar30 + local_118 + (long)pp_Var19);
                    lVar33 = lVar33 + 0x10;
                    pp_Var19 = (_func_int **)((long)pp_Var19 + lVar18);
                  } while ((int)lVar33 == 0x10);
                  uVar26 = uVar26 + 1;
                  pp_Var43 = (_func_int **)((long)pp_Var43 + 4);
                  puVar50 = (undefined4 *)((long)puVar27 + lVar33);
                } while (uVar26 != uVar49);
                puVar50 = (undefined4 *)((long)puVar27 + lVar33);
                local_1d0 = (undefined1  [8])pp_Var46;
              }
              uVar26 = uVar39 + 2;
              lVar33 = uVar39 + 3;
              pp_Var46 = pp_Var46 + lVar47;
              uVar39 = uVar26;
              local_110 = lVar44;
            } while (lVar33 < (long)local_1d8);
          }
          if ((int)uVar26 < (int)uStack_1f8._4_4_) {
            uVar26 = uVar26 & 0xffffffff;
            lVar38 = lVar18 * uVar26;
            lVar30 = lVar30 + lVar38 + local_118;
            lVar31 = lVar31 + lVar38 + local_118;
            lVar35 = lVar35 + lVar38 + local_118;
            lVar44 = lVar38 + lVar44 + local_118;
            do {
              if (0 < (int)local_1f0._0_4_) {
                lVar38 = 0;
                puVar27 = puVar50;
                do {
                  puVar21 = puVar27;
                  puVar27 = puVar50 + lVar38;
                  *puVar27 = *(undefined4 *)(lVar44 + lVar38);
                  puVar27[1] = *(undefined4 *)(lVar35 + lVar38);
                  puVar27[2] = *(undefined4 *)(lVar31 + lVar38);
                  puVar27[3] = *(undefined4 *)(lVar30 + lVar38);
                  lVar38 = lVar38 + 4;
                  puVar27 = puVar27 + 4;
                } while (uVar49 * 4 != lVar38);
                puVar50 = puVar21 + 4;
              }
              uVar26 = uVar26 + 1;
              lVar30 = lVar30 + lVar18;
              lVar31 = lVar31 + lVar18;
              lVar35 = lVar35 + lVar18;
              lVar44 = lVar44 + lVar18;
            } while (uVar26 != local_100);
          }
          uVar26 = uVar32 + 4;
          uVar39 = uVar32 + 7;
          iVar42 = iVar42 + iVar48;
          iVar17 = iVar17 + iVar48;
          iVar13 = iVar13 + iVar48;
          iVar16 = iVar16 + iVar48;
          uVar32 = uVar26;
          pCVar53 = local_128;
        } while (uVar39 < local_1e0);
      }
      uVar22 = (uint)uVar26 | 1;
      if ((int)uVar22 < (int)uVar11) {
        local_108 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        pvVar20 = (pCVar53->weight_data_tm).data;
        sVar2 = (pCVar53->weight_data_tm).elemsize;
        sVar3 = (pCVar53->weight_data_tm).cstep;
        lVar31 = (long)(int)local_1f0._0_4_;
        local_1d8 = (ulong)(int)uStack_1f8._4_4_;
        local_100 = (ulong)local_1f0 & 0xffffffff;
        lVar18 = local_108 + (long)(local_1f0._0_4_ * 3) * 4;
        iVar16 = local_1f0._0_4_ * uStack_1f8._4_4_;
        iVar48 = uVar22 * iVar16;
        local_120 = local_100 * 0x10;
        lVar47 = local_108 + (long)(local_1f0._0_4_ * 2) * 4;
        lVar44 = lVar31 * 4;
        iVar13 = iVar16 * (uint)uVar26;
        lVar56 = local_108 + lVar31 * 4;
        local_1d0 = (undefined1  [8])(lVar31 * 8);
        local_f0 = (void *)(ulong)uStack_1f8._4_4_;
        local_f8 = local_100 * 4;
        uVar32 = uVar26 & 0xffffffff;
        do {
          lVar35 = (long)iVar48;
          lVar31 = (long)iVar13;
          puVar50 = (undefined4 *)
                    ((ulong)(((uint)(uVar32 >> 2) & 0x3fffffff) +
                            (uint)(((uint)uVar32 >> 1 & 1) != 0)) * sVar2 * sVar3 + (long)pvVar20);
          if ((int)uStack_1f8._4_4_ < 4) {
            uVar26 = 0;
          }
          else {
            local_110 = CONCAT44(local_110._4_4_,iVar48);
            lVar30 = lVar18 + lVar35 * 4;
            lVar38 = lVar47 + lVar35 * 4;
            lVar33 = lVar56 + lVar35 * 4;
            lVar51 = local_108 + lVar35 * 4;
            lVar55 = lVar18 + lVar31 * 4;
            lVar40 = lVar47 + lVar31 * 4;
            lVar41 = lVar56 + lVar31 * 4;
            lVar45 = local_108 + lVar31 * 4;
            uVar49 = 0;
            do {
              if (0 < (int)local_1f0._0_4_) {
                lVar52 = 0;
                puVar27 = puVar50;
                do {
                  puVar21 = puVar27;
                  puVar27 = puVar50 + lVar52 * 2;
                  *puVar27 = *(undefined4 *)(lVar45 + lVar52);
                  puVar27[1] = *(undefined4 *)(lVar41 + lVar52);
                  puVar27[2] = *(undefined4 *)(lVar40 + lVar52);
                  puVar27[3] = *(undefined4 *)(lVar55 + lVar52);
                  puVar27[4] = *(undefined4 *)(lVar51 + lVar52);
                  puVar27[5] = *(undefined4 *)(lVar33 + lVar52);
                  puVar27[6] = *(undefined4 *)(lVar38 + lVar52);
                  puVar27[7] = *(undefined4 *)(lVar30 + lVar52);
                  lVar52 = lVar52 + 4;
                  puVar27 = puVar27 + 8;
                } while (local_f8 != lVar52);
                puVar50 = puVar21 + 8;
              }
              uVar26 = uVar49 + 4;
              lVar52 = uVar49 + 7;
              lVar30 = lVar30 + local_120;
              lVar38 = lVar38 + local_120;
              lVar33 = lVar33 + local_120;
              lVar51 = lVar51 + local_120;
              lVar55 = lVar55 + local_120;
              lVar40 = lVar40 + local_120;
              lVar41 = lVar41 + local_120;
              lVar45 = lVar45 + local_120;
              uVar49 = uVar26;
              local_118 = lVar35;
            } while (lVar52 < (long)local_1d8);
          }
          if ((int)((uint)uVar26 | 1) < (int)uStack_1f8._4_4_) {
            lVar30 = lVar44 * (uVar26 & 0xffffffff);
            lVar38 = lVar30 + lVar35 * 4 + local_108;
            lVar30 = lVar30 + lVar31 * 4 + local_108;
            uVar49 = uVar26 & 0xffffffff;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                lVar33 = lVar30;
                lVar51 = lVar38;
                do {
                  puVar27 = puVar50;
                  lVar55 = 0;
                  lVar40 = 0;
                  do {
                    *(undefined4 *)((long)puVar27 + lVar40) = *(undefined4 *)(lVar33 + lVar55);
                    *(undefined4 *)((long)puVar27 + lVar40 + 4) = *(undefined4 *)(lVar51 + lVar55);
                    lVar40 = lVar40 + 8;
                    lVar55 = lVar55 + lVar44;
                  } while ((int)lVar40 == 8);
                  uVar26 = uVar26 + 1;
                  lVar51 = lVar51 + 4;
                  lVar33 = lVar33 + 4;
                  puVar50 = (undefined4 *)((long)puVar27 + lVar40);
                } while (uVar26 != local_100);
                puVar50 = (undefined4 *)((long)puVar27 + lVar40);
              }
              uVar26 = uVar49 + 2;
              lVar33 = uVar49 + 3;
              lVar38 = lVar38 + (long)local_1d0;
              lVar30 = lVar30 + (long)local_1d0;
              uVar49 = uVar26;
            } while (lVar33 < (long)local_1d8);
          }
          if ((int)uVar26 < (int)uStack_1f8._4_4_) {
            pvVar58 = (void *)(uVar26 & 0xffffffff);
            lVar35 = lVar35 * 4 + lVar44 * (long)pvVar58 + local_108;
            lVar31 = lVar44 * (long)pvVar58 + lVar31 * 4 + local_108;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                do {
                  *puVar50 = *(undefined4 *)(lVar31 + uVar26 * 4);
                  puVar50[1] = *(undefined4 *)(lVar35 + uVar26 * 4);
                  puVar50 = puVar50 + 2;
                  uVar26 = uVar26 + 1;
                } while (local_100 != uVar26);
              }
              pvVar58 = (void *)((long)pvVar58 + 1);
              lVar35 = lVar35 + lVar44;
              lVar31 = lVar31 + lVar44;
            } while (pvVar58 != local_f0);
          }
          uVar26 = uVar32 + 2;
          lVar31 = uVar32 + 3;
          iVar48 = iVar48 + iVar16 * 2;
          iVar13 = iVar13 + iVar16 * 2;
          uVar32 = uVar26;
        } while (lVar31 < (int)uVar11);
      }
      if ((int)uVar26 < (int)local_1e0) {
        local_120 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var25);
        local_f0 = (local_128->weight_data_tm).data;
        local_f8 = (local_128->weight_data_tm).elemsize * (local_128->weight_data_tm).cstep;
        lVar47 = (long)(int)local_1f0._0_4_;
        uVar32 = (ulong)local_1f0 & 0xffffffff;
        iVar48 = local_1f0._0_4_ * uStack_1f8._4_4_;
        local_100 = CONCAT44(local_100._4_4_,iVar48);
        iVar16 = (int)uVar26 * iVar48;
        lVar18 = lVar47 * 4;
        uVar26 = uVar26 & 0xffffffff;
        do {
          local_1d8 = uVar26;
          pp_Var46 = (_func_int **)(long)iVar16;
          pvVar20 = (void *)((ulong)(((uint)local_1d8 & 1) + ((uint)(local_1d8 >> 2) & 0x3fffffff) +
                                    (uint)(((uint)local_1d8 >> 1 & 1) != 0)) * local_f8 +
                            (long)local_f0);
          if ((int)uStack_1f8._4_4_ < 4) {
            uVar26 = 0;
          }
          else {
            puVar50 = (undefined4 *)(local_120 + (long)pp_Var46 * 4);
            uVar49 = 0;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                puVar27 = puVar50;
                do {
                  pvVar58 = pvVar20;
                  lVar56 = 0;
                  puVar21 = puVar27;
                  do {
                    *(undefined4 *)((long)pvVar58 + lVar56) = *puVar21;
                    lVar56 = lVar56 + 4;
                    puVar21 = puVar21 + lVar47;
                  } while ((int)lVar56 != 0x10);
                  uVar26 = uVar26 + 1;
                  puVar27 = puVar27 + 1;
                  pvVar20 = (void *)((long)pvVar58 + lVar56);
                } while (uVar26 != uVar32);
                pvVar20 = (void *)((long)pvVar58 + lVar56);
              }
              uVar26 = uVar49 + 4;
              lVar56 = uVar49 + 7;
              puVar50 = puVar50 + uVar32 * 4;
              uVar49 = uVar26;
              local_1d0 = (undefined1  [8])pp_Var46;
            } while (lVar56 < (int)uStack_1f8._4_4_);
          }
          pp_Var46 = (_func_int **)((long)pp_Var46 * 4);
          if ((int)((uint)uVar26 | 1) < (int)uStack_1f8._4_4_) {
            puVar50 = (undefined4 *)((long)pp_Var46 + local_120 + lVar18 * (uVar26 & 0xffffffff));
            uVar49 = uVar26 & 0xffffffff;
            do {
              if (0 < (int)local_1f0._0_4_) {
                uVar26 = 0;
                puVar27 = puVar50;
                do {
                  pvVar58 = pvVar20;
                  lVar56 = 0;
                  puVar21 = puVar27;
                  do {
                    *(undefined4 *)((long)pvVar58 + lVar56) = *puVar21;
                    lVar56 = lVar56 + 4;
                    puVar21 = puVar21 + lVar47;
                  } while ((int)lVar56 == 4);
                  uVar26 = uVar26 + 1;
                  puVar27 = puVar27 + 1;
                  pvVar20 = (void *)((long)pvVar58 + lVar56);
                } while (uVar26 != uVar32);
                pvVar20 = (void *)((long)pvVar58 + lVar56);
              }
              uVar26 = uVar49 + 2;
              lVar56 = uVar49 + 3;
              puVar50 = puVar50 + lVar47 * 2;
              uVar49 = uVar26;
              local_1d0 = (undefined1  [8])pp_Var46;
            } while (lVar56 < (int)uStack_1f8._4_4_);
          }
          if ((int)uVar26 < (int)uStack_1f8._4_4_) {
            uVar26 = uVar26 & 0xffffffff;
            lVar56 = (long)pp_Var46 + local_120 + lVar18 * uVar26;
            do {
              if (0 < (int)local_1f0._0_4_) {
                lVar44 = 0;
                do {
                  *(undefined4 *)((long)pvVar20 + lVar44) = *(undefined4 *)(lVar56 + lVar44);
                  lVar44 = lVar44 + 4;
                } while (uVar32 * 4 - lVar44 != 0);
                pvVar20 = (void *)((long)pvVar20 + lVar44);
              }
              uVar26 = uVar26 + 1;
              lVar56 = lVar56 + lVar18;
            } while (uVar26 != uStack_1f8._4_4_);
          }
          iVar16 = iVar16 + iVar48;
          uVar26 = local_1d8 + 1;
        } while (local_1d8 + 1 != local_1e0);
      }
    }
    if (*(bool *)local_1e8 != true) {
      return 0;
    }
    p_Var4 = local_128->_vptr_Convolution_x86[-3];
    p_Var25 = (_func_int *)((long)&local_128->_vptr_Convolution_x86 + (long)p_Var4);
    p_Var54 = (_func_int *)((long)&(local_128->weight_winograd63_data).dims + (long)p_Var4);
    piVar1 = *(int **)((long)&(local_128->weight_winograd63_data).h + (long)p_Var4);
    if (piVar1 == (int *)0x0) goto LAB_001aff2d;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_001aff2d;
    pvVar20 = *(void **)(p_Var25 + 0x160);
    plVar6 = *(long **)(p_Var25 + 0x180);
  }
  if (plVar6 == (long *)0x0) {
    if (pvVar20 != (void *)0x0) {
      free(pvVar20);
    }
  }
  else {
    (**(code **)(*plVar6 + 0x18))();
  }
LAB_001aff2d:
  *(undefined8 *)(p_Var25 + 0x1a0) = 0;
  *(undefined8 *)(p_Var54 + 0xc) = 0;
  *(undefined8 *)(p_Var54 + 0x14) = 0;
  *(undefined8 *)p_Var54 = 0;
  *(undefined8 *)(p_Var54 + 8) = 0;
  *(undefined8 *)(p_Var25 + 0x188) = 0;
  *(undefined8 *)(p_Var25 + 400) = 0;
  *(undefined4 *)(p_Var25 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}